

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cproxy.c
# Opt level: O1

void http_digest_response
               (BinarySink *bs,ptrlen username,ptrlen password,ptrlen realm,ptrlen method,ptrlen uri
               ,ptrlen qop,ptrlen nonce,ptrlen opaque,uint32_t nonce_count,HttpDigestHash hash,
               _Bool hash_username)

{
  ssh_hashalg *psVar1;
  BinarySink *bs_00;
  char *__s;
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  ssh_hash *psVar2;
  ssh_hash *psVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  uchar *data;
  ptrlen pl_02;
  ptrlen pl_03;
  ptrlen pl_04;
  ptrlen pl_05;
  ptrlen pl_06;
  ptrlen pl_07;
  ptrlen pl_08;
  ptrlen pl_09;
  ptrlen pl_10;
  ptrlen pl_11;
  ptrlen pl_12;
  ptrlen pl_13;
  ptrlen pl_14;
  ptrlen pl_15;
  ptrlen pl_16;
  ptrlen pl_17;
  ptrlen pl_18;
  ptrlen pl_19;
  uchar client_nonce_raw [33];
  uchar rsphash [114];
  uchar a1hash [114];
  uchar a2hash [114];
  uint local_25c;
  void *local_258;
  size_t local_250;
  size_t local_248;
  size_t local_240;
  void *local_238;
  void *local_230;
  size_t local_228;
  void *local_220;
  size_t local_218;
  void *local_210;
  char local_208 [48];
  uchar local_1d8 [48];
  uchar local_1a8 [128];
  uchar local_128 [128];
  uchar local_a8 [120];
  
  local_250 = username.len;
  local_258 = username.ptr;
  psVar1 = httphashalgs[hash];
  local_25c = nonce_count >> 0x18 | (nonce_count & 0xff0000) >> 8 | (nonce_count & 0xff00) << 8 |
              nonce_count << 0x18;
  local_248 = httphashlengths[hash];
  data = local_1d8;
  random_read(data,0x21);
  lVar5 = 0;
  do {
    base64_encode_atom(data,3,local_208 + lVar5);
    data = data + 3;
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x2c);
  psVar2 = (*psVar1->new)(psVar1);
  if (psVar2 != (ssh_hash *)0x0) {
    (*psVar2->vt->reset)(psVar2);
  }
  pl.len = local_250;
  pl.ptr = local_258;
  BinarySink_put_datapl(psVar2->binarysink_,pl);
  BinarySink_put_byte(psVar2->binarysink_,':');
  local_238 = realm.ptr;
  local_240 = realm.len;
  BinarySink_put_datapl(psVar2->binarysink_,realm);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_datapl(psVar2->binarysink_,password);
  psVar3 = (*psVar2->vt->new)(psVar2->vt);
  (*psVar3->vt->copyfrom)(psVar3,psVar2);
  (*psVar3->vt->digest)(psVar3,local_128);
  (*psVar3->vt->free)(psVar3);
  (*psVar2->vt->reset)(psVar2);
  BinarySink_put_datapl(psVar2->binarysink_,method);
  BinarySink_put_byte(psVar2->binarysink_,':');
  local_210 = uri.ptr;
  local_218 = uri.len;
  BinarySink_put_datapl(psVar2->binarysink_,uri);
  psVar3 = (*psVar2->vt->new)(psVar2->vt);
  (*psVar3->vt->copyfrom)(psVar3,psVar2);
  (*psVar3->vt->digest)(psVar3,local_a8);
  (*psVar3->vt->free)(psVar3);
  (*psVar2->vt->reset)(psVar2);
  sVar6 = local_248;
  BinarySink_put_hex_data(psVar2->binarysink_,local_128,local_248);
  BinarySink_put_byte(psVar2->binarysink_,':');
  local_230 = nonce.ptr;
  BinarySink_put_datapl(psVar2->binarysink_,nonce);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_hex_data(psVar2->binarysink_,&local_25c,4);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_data(psVar2->binarysink_,local_208,0x2c);
  BinarySink_put_byte(psVar2->binarysink_,':');
  local_220 = qop.ptr;
  local_228 = qop.len;
  BinarySink_put_datapl(psVar2->binarysink_,qop);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_hex_data(psVar2->binarysink_,local_a8,sVar6);
  (*psVar2->vt->digest)(psVar2,local_1a8);
  (*psVar2->vt->free)(psVar2);
  pl_02.len = 10;
  pl_02.ptr = "username=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_02);
  if (hash_username) {
    psVar2 = (*psVar1->new)(psVar1);
    if (psVar2 != (ssh_hash *)0x0) {
      (*psVar2->vt->reset)(psVar2);
    }
    pl_00.len = local_250;
    pl_00.ptr = local_258;
    BinarySink_put_datapl(psVar2->binarysink_,pl_00);
    BinarySink_put_byte(psVar2->binarysink_,':');
    pl_03.len = local_240;
    pl_03.ptr = local_238;
    BinarySink_put_datapl(psVar2->binarysink_,pl_03);
    (*psVar2->vt->digest)(psVar2,local_128);
    (*psVar2->vt->free)(psVar2);
    sVar6 = local_248;
    BinarySink_put_hex_data(bs->binarysink_,local_128,local_248);
  }
  else {
    pl_01.len = local_250;
    pl_01.ptr = local_258;
    BinarySink_put_datapl(bs->binarysink_,pl_01);
    sVar6 = local_248;
  }
  pl_04.len = 10;
  pl_04.ptr = "\", realm=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_04);
  BinarySink_put_datapl(bs->binarysink_,realm);
  pl_05.len = 8;
  pl_05.ptr = "\", uri=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_05);
  pl_06.len = local_218;
  pl_06.ptr = local_210;
  BinarySink_put_datapl(bs->binarysink_,pl_06);
  pl_07.len = 0xd;
  pl_07.ptr = "\", algorithm=";
  BinarySink_put_datapl(bs->binarysink_,pl_07);
  bs_00 = bs->binarysink_;
  __s = httphashnames[hash];
  sVar4 = strlen(__s);
  pl_08.len = sVar4;
  pl_08.ptr = __s;
  BinarySink_put_datapl(bs_00,pl_08);
  pl_09.len = 9;
  pl_09.ptr = ", nonce=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_09);
  pl_10.len = nonce.len;
  pl_10.ptr = local_230;
  BinarySink_put_datapl(bs->binarysink_,pl_10);
  pl_11.len = 6;
  pl_11.ptr = "\", nc=";
  BinarySink_put_datapl(bs->binarysink_,pl_11);
  BinarySink_put_hex_data(bs->binarysink_,&local_25c,4);
  pl_12.len = 10;
  pl_12.ptr = ", cnonce=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_12);
  BinarySink_put_data(bs->binarysink_,local_208,0x2c);
  pl_13.len = 7;
  pl_13.ptr = "\", qop=";
  BinarySink_put_datapl(bs->binarysink_,pl_13);
  pl_14.len = local_228;
  pl_14.ptr = local_220;
  BinarySink_put_datapl(bs->binarysink_,pl_14);
  pl_15.len = 0xc;
  pl_15.ptr = ", response=\"";
  BinarySink_put_datapl(bs->binarysink_,pl_15);
  BinarySink_put_hex_data(bs->binarysink_,local_1a8,sVar6);
  pl_16.len = 1;
  pl_16.ptr = "\"";
  BinarySink_put_datapl(bs->binarysink_,pl_16);
  if (opaque.ptr != (void *)0x0) {
    pl_17.len = 10;
    pl_17.ptr = ", opaque=\"";
    BinarySink_put_datapl(bs->binarysink_,pl_17);
    BinarySink_put_datapl(bs->binarysink_,opaque);
    pl_18.len = 1;
    pl_18.ptr = "\"";
    BinarySink_put_datapl(bs->binarysink_,pl_18);
  }
  if (hash_username) {
    pl_19.len = 0xf;
    pl_19.ptr = ", userhash=true";
    BinarySink_put_datapl(bs->binarysink_,pl_19);
  }
  smemclr(local_128,0x72);
  smemclr(local_a8,0x72);
  smemclr(local_1a8,0x72);
  smemclr(local_1d8,0x21);
  smemclr(local_208,0x2c);
  return;
}

Assistant:

void http_digest_response(BinarySink *bs, ptrlen username, ptrlen password,
                          ptrlen realm, ptrlen method, ptrlen uri, ptrlen qop,
                          ptrlen nonce, ptrlen opaque, uint32_t nonce_count,
                          HttpDigestHash hash, bool hash_username)
{
    unsigned char a1hash[MAX_HASH_LEN];
    unsigned char a2hash[MAX_HASH_LEN];
    unsigned char rsphash[MAX_HASH_LEN];
    const ssh_hashalg *alg = httphashalgs[hash];
    size_t hashlen = httphashlengths[hash];

    unsigned char ncbuf[4];
    PUT_32BIT_MSB_FIRST(ncbuf, nonce_count);

    unsigned char client_nonce_raw[33];
    random_read(client_nonce_raw, lenof(client_nonce_raw));
    char client_nonce_base64[lenof(client_nonce_raw) / 3 * 4];
    for (unsigned i = 0; i < lenof(client_nonce_raw)/3; i++)
        base64_encode_atom(client_nonce_raw + 3*i, 3,
                           client_nonce_base64 + 4*i);

    /*
     * RFC 7616 section 3.4.2: the hash "A1" is a hash of
     * username:realm:password (in the absence of hash names like
     * "MD5-sess" which as far as I know don't sensibly apply to
     * proxies and HTTP CONNECT).
     */
    ssh_hash *h = ssh_hash_new(alg);
    put_datapl(h, username);
    put_byte(h, ':');
    put_datapl(h, realm);
    put_byte(h, ':');
    put_datapl(h, password);
    ssh_hash_digest_nondestructive(h, a1hash);

    /*
     * RFC 7616 section 3.4.3: the hash "A2" is a hash of method:uri
     * (in the absence of more interesting quality-of-protection
     * schemes than plain "auth" - e.g. "auth-int" hashes the entire
     * document as well - which again I don't think make sense in the
     * context of proxies and CONNECT).
     */
    ssh_hash_reset(h);
    put_datapl(h, method);
    put_byte(h, ':');
    put_datapl(h, uri);
    ssh_hash_digest_nondestructive(h, a2hash);

    /*
     * RFC 7616 section 3.4.1: the overall output hash in the
     * "response" parameter of the authorization header is a hash of
     * A1:nonce:nonce-count:client-nonce:qop:A2, where A1 and A2 are
     * the hashes computed above.
     */
    ssh_hash_reset(h);
    put_hex_data(h, a1hash, hashlen);
    put_byte(h, ':');
    put_datapl(h, nonce);
    put_byte(h, ':');
    put_hex_data(h, ncbuf, 4);
    put_byte(h, ':');
    put_data(h, client_nonce_base64, lenof(client_nonce_base64));
    put_byte(h, ':');
    put_datapl(h, qop);
    put_byte(h, ':');
    put_hex_data(h, a2hash, hashlen);
    ssh_hash_final(h, rsphash);

    /*
     * Now construct the output header (everything after the initial
     * "Proxy-Authorization: Digest ") and write it to the provided
     * BinarySink.
     */
    put_datalit(bs, "username=\"");
    if (hash_username) {
        /*
         * RFC 7616 section 3.4.4: if we're hashing the username, we
         * actually hash username:realm (like a truncated version of
         * A1 above).
         */
        ssh_hash *h = ssh_hash_new(alg);
        put_datapl(h, username);
        put_byte(h, ':');
        put_datapl(h, realm);
        ssh_hash_final(h, a1hash);
        put_hex_data(bs, a1hash, hashlen);
    } else {
        put_datapl(bs, username);
    }
    put_datalit(bs, "\", realm=\"");
    put_datapl(bs, realm);
    put_datalit(bs, "\", uri=\"");
    put_datapl(bs, uri);
    put_datalit(bs, "\", algorithm=");
    put_dataz(bs, httphashnames[hash]);
    put_datalit(bs, ", nonce=\"");
    put_datapl(bs, nonce);
    put_datalit(bs, "\", nc=");
    put_hex_data(bs, ncbuf, 4);
    put_datalit(bs, ", cnonce=\"");
    put_data(bs, client_nonce_base64, lenof(client_nonce_base64));
    put_datalit(bs, "\", qop=");
    put_datapl(bs, qop);
    put_datalit(bs, ", response=\"");
    put_hex_data(bs, rsphash, hashlen);
    put_datalit(bs, "\"");

    if (opaque.ptr) {
        put_datalit(bs, ", opaque=\"");
        put_datapl(bs, opaque);
        put_datalit(bs, "\"");
    }

    if (hash_username) {
        put_datalit(bs, ", userhash=true");
    }

    smemclr(a1hash, lenof(a1hash));
    smemclr(a2hash, lenof(a2hash));
    smemclr(rsphash, lenof(rsphash));
    smemclr(client_nonce_raw, lenof(client_nonce_raw));
    smemclr(client_nonce_base64, lenof(client_nonce_base64));
}